

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infofnt_prepare(XFontSet fs)

{
  int iVar1;
  undefined1 local_38 [8];
  char **names;
  XFontStruct **fonts;
  XFontSetExtents *extents;
  wchar_t i;
  wchar_t font_count;
  infofnt *ifnt;
  XFontSet fs_local;
  
  _i = Infofnt;
  Infofnt->fs = fs;
  ifnt = (infofnt *)fs;
  fonts = (XFontStruct **)XExtentsOfFontSet(fs);
  iVar1 = XFontsOfFontSet(ifnt,&names,local_38);
  _i->asc = 0;
  for (extents._0_4_ = 0; (int)extents < iVar1; extents._0_4_ = (int)extents + 1) {
    if ((int)_i->asc < *(int *)(*names + 0x58)) {
      _i->asc = (int16_t)*(undefined4 *)(*names + 0x58);
    }
    names = names + 1;
  }
  _i->hgt = *(int16_t *)((long)fonts + 0xe);
  _i->wid = *(int16_t *)((long)fonts + 0xc);
  _i->twid = *(int16_t *)((long)fonts + 0xc);
  return 0;
}

Assistant:

static errr Infofnt_prepare(XFontSet fs)
{
	infofnt *ifnt = Infofnt;
	int font_count, i;
	XFontSetExtents *extents;
	XFontStruct **fonts;
	char **names;

	/* Assign the struct */
	ifnt->fs = fs;
	extents = XExtentsOfFontSet(fs);

	font_count = XFontsOfFontSet(fs, &fonts, &names);
	ifnt->asc = 0;
	for (i = 0; i < font_count; i++, fonts++)
	   if (ifnt->asc < (*fonts)->ascent) ifnt->asc = (*fonts)->ascent;

	/* Extract default sizing info */
	ifnt->hgt = extents->max_logical_extent.height;
	ifnt->wid = extents->max_logical_extent.width;
	ifnt->twid = extents->max_logical_extent.width;

	/* Success */
	return (0);
}